

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

double __thiscall Mat::NormInf(Mat *this)

{
  int iVar1;
  int __x;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined8 local_40;
  undefined4 local_1c;
  double dStack_18;
  int i;
  double output;
  Mat *this_local;
  Mat *pMVar2;
  
  std::abs((int)this);
  local_1c = 1;
  dStack_18 = extraout_XMM0_Qa;
  while( true ) {
    pMVar2 = this;
    iVar1 = Size(this);
    __x = (int)pMVar2;
    if (iVar1 <= local_1c) break;
    std::abs(__x);
    if (extraout_XMM0_Qa_00 <= dStack_18) {
      local_40 = dStack_18;
    }
    else {
      std::abs(__x);
      local_40 = extraout_XMM0_Qa_01;
    }
    dStack_18 = local_40;
    local_1c = local_1c + 1;
  }
  return dStack_18;
}

Assistant:

double Mat::NormInf()
{	
	double output = abs(v_[0]);	
	for (int i = 1; i < Size(); i++)
		output = output<abs(v_[i]) ? output=abs (v_[i]):output;
	return output;
}